

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O3

bool dxil_spv::emit_i8_dot_instruction(Impl *impl,CallInst *instruction,bool sign_extend)

{
  Id arg;
  Id value_id;
  Id value_id_00;
  Id IVar1;
  Id arg_00;
  Id type_id;
  Builder *this;
  Value *pVVar2;
  Operation *pOVar3;
  Operation *pOVar4;
  undefined1 in_R8B;
  uint offset;
  Capability local_38 [2];
  
  this = Converter::Impl::builder(impl);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  offset = 0;
  arg = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  value_id = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  value_id_00 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  if ((impl->options).shader_i8_dot_enabled == false) {
    do {
      IVar1 = build_bfe(impl,value_id,offset,(uint)sign_extend,(bool)in_R8B);
      arg_00 = build_bfe(impl,value_id_00,offset,(uint)sign_extend,(bool)in_R8B);
      type_id = spv::Builder::makeIntegerType(this,0x20,false);
      pOVar3 = Converter::Impl::allocate(impl,OpIMul,type_id);
      Operation::add_id(pOVar3,IVar1);
      Operation::add_id(pOVar3,arg_00);
      Converter::Impl::add(impl,pOVar3,false);
      IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
      pOVar4 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
      Operation::add_id(pOVar4,arg);
      Operation::add_id(pOVar4,pOVar3->id);
      arg = pOVar4->id;
      Converter::Impl::add(impl,pOVar4,false);
      offset = offset + 8;
    } while (offset != 0x20);
    Converter::Impl::rewrite_value(impl,(Value *)instruction,arg);
  }
  else {
    spv::Builder::addExtension(this,"SPV_KHR_integer_dot_product");
    local_38[0] = CapabilityDotProduct;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,local_38);
    local_38[1] = 0x1782;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,local_38 + 1);
    IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
    pOVar3 = Converter::Impl::allocate(impl,sign_extend ^ OpUDot,IVar1);
    Operation::add_id(pOVar3,value_id);
    Operation::add_id(pOVar3,value_id_00);
    Operation::add_literal(pOVar3,0);
    Converter::Impl::add(impl,pOVar3,false);
    pOVar4 = Converter::Impl::allocate(impl,OpIAdd,(Value *)instruction);
    Operation::add_id(pOVar4,arg);
    Operation::add_id(pOVar4,pOVar3->id);
    Converter::Impl::add(impl,pOVar4,false);
  }
  return true;
}

Assistant:

bool emit_i8_dot_instruction(Converter::Impl &impl, const llvm::CallInst *instruction, bool sign_extend)
{
	auto &builder = impl.builder();
	spv::Id acc = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id a = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id b = impl.get_id_for_value(instruction->getOperand(3));

	if (impl.options.shader_i8_dot_enabled)
	{
		builder.addExtension("SPV_KHR_integer_dot_product");
		builder.addCapability(spv::CapabilityDotProductKHR);
		builder.addCapability(spv::CapabilityDotProductInput4x8BitPackedKHR);

		// Not supposed to saturate.
		auto *dot_op = impl.allocate(sign_extend ? spv::OpSDotKHR : spv::OpUDotKHR, builder.makeUintType(32));
		dot_op->add_id(a);
		dot_op->add_id(b);
		dot_op->add_literal(spv::PackedVectorFormatPackedVectorFormat4x8BitKHR);
		impl.add(dot_op);

		auto *acc_op = impl.allocate(spv::OpIAdd, instruction);
		acc_op->add_id(acc);
		acc_op->add_id(dot_op->id);
		impl.add(acc_op);
	}
	else
	{
		for (unsigned i = 0; i < 4; i++)
		{
			spv::Id a_component = build_bfe(impl, a, 8 * i, 8, sign_extend);
			spv::Id b_component = build_bfe(impl, b, 8 * i, 8, sign_extend);
			auto *mul_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
			mul_op->add_id(a_component);
			mul_op->add_id(b_component);
			impl.add(mul_op);

			auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
			add_op->add_id(acc);
			add_op->add_id(mul_op->id);
			acc = add_op->id;
			impl.add(add_op);
		}

		impl.rewrite_value(instruction, acc);
	}

	return true;
}